

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::ServiceOptions::_InternalParse(ServiceOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  ParseContext *pPVar2;
  uint64_t uVar3;
  UninterpretedOption *msg;
  ulong uVar4;
  ServiceOptions *containing_type;
  UnknownFieldSet *unknown;
  uint local_28;
  HasBits<1UL> local_24;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  ServiceOptions *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits(&local_24);
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_006ac3cc;
      pPVar2 = (ParseContext *)internal::ReadTag((char *)ctx_local,&local_28,0);
      ctx_local = pPVar2;
      if (local_28 >> 3 == 0x21) break;
      if ((local_28 >> 3 == 999) && ((local_28 & 0xff) == 0x3a)) {
        ctx_local = (ParseContext *)((long)&pPVar2[-1].data_.arena + 6);
        do {
          pPVar2 = _tag;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
          msg = _internal_add_uninterpreted_option(this);
          ctx_local = (ParseContext *)
                      internal::ParseContext::ParseMessage
                                (pPVar2,(MessageLite *)msg,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) goto LAB_006ac3e7;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&_tag->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<7994u>((char *)ctx_local), bVar1));
      }
      else {
LAB_006ac2eb:
        if ((local_28 == 0) || ((local_28 & 7) == 4)) {
          if (pPVar2 != (ParseContext *)0x0) {
            internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,local_28);
            goto LAB_006ac3cc;
          }
          goto LAB_006ac3e7;
        }
        if (local_28 < 8000) {
          uVar4 = (ulong)local_28;
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                              (&(this->super_Message).super_MessageLite._internal_metadata_);
          ctx_local = (ParseContext *)
                      internal::UnknownFieldParse(uVar4,unknown,(char *)ctx_local,_tag);
        }
        else {
          uVar4 = (ulong)local_28;
          containing_type = internal_default_instance();
          ctx_local = (ParseContext *)
                      internal::ExtensionSet::ParseField
                                (&this->_extensions_,uVar4,(char *)pPVar2,
                                 &containing_type->super_Message,
                                 &(this->super_Message).super_MessageLite._internal_metadata_,_tag);
        }
        if (ctx_local == (ParseContext *)0x0) goto LAB_006ac3e7;
      }
    }
    if ((local_28 & 0xff) != 8) goto LAB_006ac2eb;
    _Internal::set_has_deprecated(&local_24);
    uVar3 = internal::ReadVarint64((char **)&ctx_local);
    this->deprecated_ = uVar3 != 0;
  } while (ctx_local != (ParseContext *)0x0);
LAB_006ac3e7:
  ctx_local = (ParseContext *)0x0;
LAB_006ac3cc:
  internal::HasBits<1UL>::Or(&this->_has_bits_,&local_24);
  return (char *)ctx_local;
}

Assistant:

const char* ServiceOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    if ((8000u <= tag)) {
      ptr = _extensions_.ParseField(tag, ptr, internal_default_instance(), &_internal_metadata_, ctx);
      CHK_(ptr != nullptr);
      continue;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}